

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::GzipInputStream::GzipInputStream
          (GzipInputStream *this,ZeroCopyInputStream *sub_stream,Format format,int buffer_size)

{
  void *pvVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  LogMessageFatal local_40 [19];
  Voidify local_2d [13];
  int local_20;
  Format local_1c;
  int buffer_size_local;
  Format format_local;
  ZeroCopyInputStream *sub_stream_local;
  GzipInputStream *this_local;
  
  local_20 = buffer_size;
  local_1c = format;
  _buffer_size_local = sub_stream;
  sub_stream_local = &this->super_ZeroCopyInputStream;
  ZeroCopyInputStream::ZeroCopyInputStream(&this->super_ZeroCopyInputStream);
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__GzipInputStream_008a91d0;
  this->format_ = local_1c;
  this->sub_stream_ = _buffer_size_local;
  this->zerror_ = 0;
  this->byte_count_ = 0;
  (this->zcontext_).state = (internal_state *)0x0;
  (this->zcontext_).zalloc = (alloc_func)0x0;
  (this->zcontext_).zfree = (free_func)0x0;
  (this->zcontext_).opaque = (voidpf)0x0;
  (this->zcontext_).total_out = 0;
  (this->zcontext_).next_in = (Bytef *)0x0;
  (this->zcontext_).avail_in = 0;
  (this->zcontext_).total_in = 0;
  (this->zcontext_).msg = (char *)0x0;
  if (local_20 == -1) {
    this->output_buffer_length_ = 0x10000;
  }
  else {
    this->output_buffer_length_ = (long)local_20;
  }
  pvVar1 = operator_new(this->output_buffer_length_);
  this->output_buffer_ = pvVar1;
  if (this->output_buffer_ != (void *)0x0) {
    (this->zcontext_).next_out = (Bytef *)this->output_buffer_;
    (this->zcontext_).avail_out = (uInt)this->output_buffer_length_;
    this->output_position_ = this->output_buffer_;
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"output_buffer_ != nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/gzip_stream.cc"
             ,0x2e,local_50._M_len,local_50._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
  absl::lts_20240722::log_internal::Voidify::operator&&(local_2d,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

GzipInputStream::GzipInputStream(ZeroCopyInputStream* sub_stream, Format format,
                                 int buffer_size)
    : format_(format), sub_stream_(sub_stream), zerror_(Z_OK), byte_count_(0) {
  zcontext_.state = Z_NULL;
  zcontext_.zalloc = Z_NULL;
  zcontext_.zfree = Z_NULL;
  zcontext_.opaque = Z_NULL;
  zcontext_.total_out = 0;
  zcontext_.next_in = nullptr;
  zcontext_.avail_in = 0;
  zcontext_.total_in = 0;
  zcontext_.msg = nullptr;
  if (buffer_size == -1) {
    output_buffer_length_ = kDefaultBufferSize;
  } else {
    output_buffer_length_ = buffer_size;
  }
  output_buffer_ = operator new(output_buffer_length_);
  ABSL_CHECK(output_buffer_ != nullptr);
  zcontext_.next_out = static_cast<Bytef*>(output_buffer_);
  zcontext_.avail_out = output_buffer_length_;
  output_position_ = output_buffer_;
}